

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sumStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  SumCtx *pSVar1;
  int iVar2;
  sqlite3_int64 sVar3;
  double dVar4;
  i64 local_38;
  i64 x;
  SumCtx *pSStack_28;
  int type;
  SumCtx *p;
  sqlite3_value **argv_local;
  sqlite3_context *psStack_10;
  int argc_local;
  sqlite3_context *context_local;
  
  p = (SumCtx *)argv;
  argv_local._4_4_ = argc;
  psStack_10 = context;
  pSStack_28 = (SumCtx *)sqlite3_aggregate_context(context,0x28);
  x._4_4_ = sqlite3_value_numeric_type((sqlite3_value *)p->rSum);
  pSVar1 = pSStack_28;
  if ((pSStack_28 != (SumCtx *)0x0) && (x._4_4_ != 5)) {
    pSStack_28->cnt = pSStack_28->cnt + 1;
    if (pSStack_28->approx == '\0') {
      if (x._4_4_ == 1) {
        local_38 = pSStack_28->iSum;
        sVar3 = sqlite3_value_int64((sqlite3_value *)p->rSum);
        iVar2 = sqlite3AddInt64(&local_38,sVar3);
        if (iVar2 == 0) {
          pSStack_28->iSum = local_38;
        }
        else {
          pSStack_28->ovrfl = '\x01';
          kahanBabuskaNeumaierInit(pSStack_28,pSStack_28->iSum);
          pSVar1 = pSStack_28;
          pSStack_28->approx = '\x01';
          sVar3 = sqlite3_value_int64((sqlite3_value *)p->rSum);
          kahanBabuskaNeumaierStepInt64(pSVar1,sVar3);
        }
      }
      else {
        kahanBabuskaNeumaierInit(pSStack_28,pSStack_28->iSum);
        pSVar1 = pSStack_28;
        pSStack_28->approx = '\x01';
        dVar4 = sqlite3_value_double((sqlite3_value *)p->rSum);
        kahanBabuskaNeumaierStep(pSVar1,dVar4);
      }
    }
    else if (x._4_4_ == 1) {
      sVar3 = sqlite3_value_int64((sqlite3_value *)p->rSum);
      kahanBabuskaNeumaierStepInt64(pSVar1,sVar3);
    }
    else {
      pSStack_28->ovrfl = '\0';
      dVar4 = sqlite3_value_double((sqlite3_value *)p->rSum);
      kahanBabuskaNeumaierStep(pSVar1,dVar4);
    }
  }
  return;
}

Assistant:

static void sumStep(sqlite3_context *context, int argc, sqlite3_value **argv){
  SumCtx *p;
  int type;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  p = sqlite3_aggregate_context(context, sizeof(*p));
  type = sqlite3_value_numeric_type(argv[0]);
  if( p && type!=SQLITE_NULL ){
    p->cnt++;
    if( p->approx==0 ){
      if( type!=SQLITE_INTEGER ){
        kahanBabuskaNeumaierInit(p, p->iSum);
        p->approx = 1;
        kahanBabuskaNeumaierStep(p, sqlite3_value_double(argv[0]));
      }else{
        i64 x = p->iSum;
        if( sqlite3AddInt64(&x, sqlite3_value_int64(argv[0]))==0 ){
          p->iSum = x;
        }else{
          p->ovrfl = 1;
          kahanBabuskaNeumaierInit(p, p->iSum);
          p->approx = 1;
          kahanBabuskaNeumaierStepInt64(p, sqlite3_value_int64(argv[0]));
        }
      }
    }else{
      if( type==SQLITE_INTEGER ){
        kahanBabuskaNeumaierStepInt64(p, sqlite3_value_int64(argv[0]));
      }else{
        p->ovrfl = 0;
        kahanBabuskaNeumaierStep(p, sqlite3_value_double(argv[0]));
      }
    }
  }
}